

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::HlslParseContext::handleFunctionCall
          (HlslParseContext *this,TSourceLoc *loc,TFunction *function,TIntermTyped *arguments)

{
  TIntermediate *pTVar1;
  TFunction *pTVar2;
  TOperator op_00;
  TIntermTyped *pTVar3;
  TFunction *loc_00;
  bool bVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_type sVar8;
  undefined4 extraout_var_02;
  reference ppTVar9;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  TType *pTVar10;
  undefined4 extraout_var_07;
  size_type sVar11;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  reference __str;
  undefined4 extraout_var_12;
  TVariable *variable;
  TIntermSymbol *front;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  long lVar12;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_00;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  TIntermTyped *local_298;
  bool local_279;
  TIntermTyped *local_278;
  int local_25c;
  value_type local_258;
  int memb;
  TStorageQualifier qual;
  int i;
  TQualifierList *qualifierList;
  TIntermTyped *fnNode;
  TIntermAggregate *call;
  undefined1 local_210 [8];
  TString callerName;
  TSymbol *symbol;
  TString mangle;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_1b0;
  long *local_188;
  TIntermTyped *arg0;
  TIntermAggregate *aggregate;
  int thisDepth;
  bool builtIn;
  TFunction *fnCandidate;
  pool_allocator<char> local_160;
  TString local_158;
  pool_allocator<char> local_130;
  TString local_128;
  TString local_100;
  undefined1 local_d8 [8];
  TType type;
  TIntermConstantUnion *pTStack_38;
  TOperator op;
  TIntermTyped *result;
  TIntermTyped *arguments_local;
  TFunction *function_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  pTStack_38 = (TIntermConstantUnion *)0x0;
  result = arguments;
  arguments_local = (TIntermTyped *)function;
  function_local = (TFunction *)loc;
  loc_local = (TSourceLoc *)this;
  type.spirvType._4_4_ = (*(function->super_TSymbol)._vptr_TSymbol[0x1b])();
  if (type.spirvType._4_4_ != EOpNull) {
    TType::TType((TType *)local_d8,EbtVoid,EvqTemporary,1,0,0,false);
    bVar4 = constructorError(this,(TSourceLoc *)function_local,&result->super_TIntermNode,
                             (TFunction *)arguments_local,type.spirvType._4_4_,(TType *)local_d8);
    if ((bVar4) ||
       (pTStack_38 = (TIntermConstantUnion *)
                     handleConstructor(this,(TSourceLoc *)function_local,result,(TType *)local_d8),
       pTVar2 = function_local, pTStack_38 != (TIntermConstantUnion *)0x0)) {
      fnCandidate._4_4_ = 0;
    }
    else {
      pool_allocator<char>::pool_allocator(&local_130);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_128,"",&local_130);
      pool_allocator<char>::pool_allocator(&local_160);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_158,"",&local_160);
      TType::getCompleteString
                (&local_100,(TType *)local_d8,false,true,true,true,&local_128,&local_158);
      pcVar7 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         (&local_100);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar2,"cannot construct with these arguments",pcVar7,"");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_100);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_158);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_128);
      this_local = (HlslParseContext *)0x0;
      fnCandidate._4_4_ = 1;
    }
    TType::~TType((TType *)local_d8);
    if (fnCandidate._4_4_ != 0) {
      return (TIntermTyped *)this_local;
    }
    goto LAB_00565500;
  }
  _thisDepth = (TFunction *)0x0;
  aggregate._7_1_ = 0;
  aggregate._0_4_ = 0;
  iVar5 = (*(arguments_local->super_TIntermNode)._vptr_TIntermNode[3])();
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)CONCAT44(extraout_var,iVar5),"mul");
  if (bVar4) {
    addGenMulArgumentConversion
              (this,(TSourceLoc *)function_local,(TFunction *)arguments_local,&result);
  }
  if (result == (TIntermTyped *)0x0) {
    local_278 = (TIntermTyped *)0x0;
  }
  else {
    iVar5 = (*(result->super_TIntermNode)._vptr_TIntermNode[6])();
    local_278 = (TIntermTyped *)CONCAT44(extraout_var_00,iVar5);
  }
  arg0 = local_278;
  if (result != (TIntermTyped *)0x0) {
    local_188 = (long *)0x0;
    if (local_278 == (TIntermTyped *)0x0) {
LAB_00564cd1:
      iVar5 = (*(result->super_TIntermNode)._vptr_TIntermNode[0xc])();
      if (CONCAT44(extraout_var_05,iVar5) != 0) {
        iVar5 = (*(result->super_TIntermNode)._vptr_TIntermNode[0xc])();
        local_188 = (long *)CONCAT44(extraout_var_06,iVar5);
      }
    }
    else {
      iVar5 = (*(local_278->super_TIntermNode)._vptr_TIntermNode[0x32])();
      sVar8 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::size
                        ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                         CONCAT44(extraout_var_01,iVar5));
      if (sVar8 == 0) goto LAB_00564cd1;
      iVar5 = (*(arg0->super_TIntermNode)._vptr_TIntermNode[0x32])();
      ppTVar9 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                          ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                           CONCAT44(extraout_var_02,iVar5),0);
      if (*ppTVar9 == (value_type)0x0) goto LAB_00564cd1;
      iVar5 = (*(arg0->super_TIntermNode)._vptr_TIntermNode[0x32])();
      ppTVar9 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                          ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                           CONCAT44(extraout_var_03,iVar5),0);
      iVar5 = (*(*ppTVar9)->_vptr_TIntermNode[3])();
      local_188 = (long *)CONCAT44(extraout_var_04,iVar5);
    }
    if (local_188 != (long *)0x0) {
      pTVar10 = (TType *)(**(code **)(*local_188 + 0xf0))();
      bVar4 = isStructBufferType(this,pTVar10);
      if (bVar4) {
        iVar5 = (*(arguments_local->super_TIntermNode)._vptr_TIntermNode[3])();
        sVar11 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::length
                           ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)CONCAT44(extraout_var_07,iVar5));
        mangle.field_2._M_local_buf[0xf] = '\0';
        local_279 = false;
        if (5 < sVar11) {
          iVar5 = (*(arguments_local->super_TIntermNode)._vptr_TIntermNode[3])();
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          substr(&local_1b0,
                 (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 CONCAT44(extraout_var_08,iVar5),5,0xffffffffffffffff);
          mangle.field_2._M_local_buf[0xf] = '\x01';
          local_279 = isStructBufferMethod(this,&local_1b0);
        }
        if ((mangle.field_2._M_local_buf[0xf] & 1U) != 0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string(&local_1b0);
        }
        if (local_279 != false) {
          iVar5 = (*(arguments_local->super_TIntermNode)._vptr_TIntermNode[3])();
          std::operator+((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)&symbol,
                         (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)CONCAT44(extraout_var_09,iVar5),"(");
          callerName.field_2._8_8_ =
               TSymbolTable::find((this->super_TParseContextBase).symbolTable,(TString *)&symbol,
                                  (bool *)((long)&aggregate + 7),(bool *)0x0,(int *)0x0);
          if ((TSymbol *)callerName.field_2._8_8_ != (TSymbol *)0x0) {
            iVar5 = (*((TSymbol *)callerName.field_2._8_8_)->_vptr_TSymbol[7])();
            _thisDepth = (TFunction *)CONCAT44(extraout_var_10,iVar5);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)&symbol);
        }
      }
    }
  }
  if (_thisDepth == (TFunction *)0x0) {
    _thisDepth = findFunction(this,(TSourceLoc *)function_local,(TFunction *)arguments_local,
                              (bool *)((long)&aggregate + 7),(int *)&aggregate,&result);
  }
  if (_thisDepth != (TFunction *)0x0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 local_210);
    if ((int)aggregate == 0) {
      iVar5 = (*(_thisDepth->super_TSymbol)._vptr_TSymbol[6])();
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                local_210,
                (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                CONCAT44(extraout_var_11,iVar5));
    }
    else {
      sVar8 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
              ::size(&(this->currentTypePrefix).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                    );
      __str = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
              ::operator[](&(this->currentTypePrefix).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                           ,sVar8 - (long)(int)aggregate);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                local_210,__str);
      iVar5 = (*(_thisDepth->super_TSymbol)._vptr_TSymbol[6])();
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 local_210,
                 (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 CONCAT44(extraout_var_12,iVar5));
      pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      variable = getImplicitThis(this,(int)aggregate);
      front = TIntermediate::addSymbol(pTVar1,variable);
      pushFrontArguments(this,&front->super_TIntermTyped,&result);
    }
    if (result != (TIntermTyped *)0x0) {
      addInputArgumentConversions(this,_thisDepth,&result);
    }
    if ((result != (TIntermTyped *)0x0) && ((aggregate._7_1_ & 1) == 0)) {
      expandArguments(this,(TSourceLoc *)function_local,_thisDepth,&result);
    }
    if (result == (TIntermTyped *)0x0) {
      local_298 = (TIntermTyped *)0x0;
    }
    else {
      iVar5 = (*(result->super_TIntermNode)._vptr_TIntermNode[6])();
      local_298 = (TIntermTyped *)CONCAT44(extraout_var_13,iVar5);
    }
    arg0 = local_298;
    type.spirvType._4_4_ = (*(_thisDepth->super_TSymbol)._vptr_TSymbol[0x1b])();
    pTVar3 = result;
    if (((aggregate._7_1_ & 1) == 0) || (type.spirvType._4_4_ == EOpNull)) {
      pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      iVar5 = (*(_thisDepth->super_TSymbol)._vptr_TSymbol[0xc])();
      pTStack_38 = (TIntermConstantUnion *)
                   TIntermediate::setAggregateOperator
                             (pTVar1,&pTVar3->super_TIntermNode,EOpFunctionCall,
                              (TType *)CONCAT44(extraout_var_18,iVar5),(TSourceLoc *)function_local)
      ;
      iVar5 = (*(pTStack_38->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[6])();
      fnNode = (TIntermTyped *)CONCAT44(extraout_var_19,iVar5);
      (*(fnNode->super_TIntermNode)._vptr_TIntermNode[0x34])(fnNode,local_210);
      if ((aggregate._7_1_ & 1) == 0) {
        (*(fnNode->super_TIntermNode)._vptr_TIntermNode[0x36])();
        TIntermediate::addToCallGraph
                  ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                   (this->super_TParseContextBase).super_TParseVersions.infoSink,
                   &this->currentCaller,(TString *)local_210);
      }
    }
    else {
      bVar4 = TParseVersions::hlslDX9Compatible((TParseVersions *)this);
      pTVar2 = function_local;
      if ((!bVar4) && (type.spirvType._4_4_ == EOpRound)) {
        type.spirvType._4_4_ = EOpRoundEven;
      }
      op_00 = type.spirvType._4_4_;
      pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      iVar5 = (*(_thisDepth->super_TSymbol)._vptr_TSymbol[0x24])();
      pTVar3 = result;
      iVar6 = (*(_thisDepth->super_TSymbol)._vptr_TSymbol[0xc])();
      pTStack_38 = (TIntermConstantUnion *)
                   TIntermediate::addBuiltInFunctionCall
                             (pTVar1,(TSourceLoc *)pTVar2,op_00,iVar5 == 1,
                              &pTVar3->super_TIntermNode,(TType *)CONCAT44(extraout_var_14,iVar6));
      if (pTStack_38 == (TIntermConstantUnion *)0x0) {
        iVar5 = (**(result->super_TIntermNode)._vptr_TIntermNode)();
        TIntermTyped::getCompleteString_abi_cxx11_((TString *)&call,result,false);
        pcVar7 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)&call);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,CONCAT44(extraout_var_15,iVar5)," wrong operand type","Internal Error",
                   "built in unary operator function.  Type: %s",pcVar7);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      &call);
      }
      else {
        iVar5 = (*(pTStack_38->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[4])();
        loc_00 = function_local;
        pTVar2 = _thisDepth;
        if (CONCAT44(extraout_var_16,iVar5) != 0) {
          iVar5 = (*(pTStack_38->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[4])();
          builtInOpCheck(this,(TSourceLoc *)loc_00,pTVar2,
                         (TIntermOperator *)CONCAT44(extraout_var_17,iVar5));
        }
      }
    }
    qualifierList = (TQualifierList *)pTStack_38;
    decomposeStructBufferMethods
              (this,(TSourceLoc *)function_local,(TIntermTyped **)&stack0xffffffffffffffc8,
               &result->super_TIntermNode);
    decomposeIntrinsic(this,(TSourceLoc *)function_local,(TIntermTyped **)&stack0xffffffffffffffc8,
                       &result->super_TIntermNode);
    decomposeSampleMethods
              (this,(TSourceLoc *)function_local,(TIntermTyped **)&stack0xffffffffffffffc8,
               &result->super_TIntermNode);
    decomposeGeometryMethods
              (this,(TSourceLoc *)function_local,(TIntermTyped **)&stack0xffffffffffffffc8,
               &result->super_TIntermNode);
    if ((pTStack_38 == (TIntermConstantUnion *)qualifierList) &&
       (iVar5 = (*(pTStack_38->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[6])(),
       CONCAT44(extraout_var_20,iVar5) != 0)) {
      iVar5 = (*(pTStack_38->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[6])();
      _qual = (vector<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>
               *)(**(code **)(*(long *)CONCAT44(extraout_var_21,iVar5) + 0x1c0))();
      for (memb = 0; iVar5 = memb, iVar6 = (*(_thisDepth->super_TSymbol)._vptr_TSymbol[0x24])(),
          iVar5 < iVar6; memb = memb + 1) {
        iVar5 = (*(_thisDepth->super_TSymbol)._vptr_TSymbol[0x28])(_thisDepth,(ulong)(uint)memb);
        lVar12 = (**(code **)(**(long **)(CONCAT44(extraout_var_22,iVar5) + 8) + 0x50))();
        local_258 = (value_type)*(undefined8 *)(lVar12 + 8) & 0x7f;
        iVar5 = (*(_thisDepth->super_TSymbol)._vptr_TSymbol[0x28])(_thisDepth,(ulong)(uint)memb);
        bVar4 = hasStructBuffCounter(this,*(TType **)(CONCAT44(extraout_var_23,iVar5) + 8));
        if (bVar4) {
          std::
          vector<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>::
          push_back(_qual,&local_258);
          std::
          vector<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>::
          push_back(_qual,&local_258);
        }
        else {
          iVar5 = (*(_thisDepth->super_TSymbol)._vptr_TSymbol[0x28])(_thisDepth,(ulong)(uint)memb);
          pTVar10 = *(TType **)(CONCAT44(extraout_var_24,iVar5) + 8);
          iVar5 = (*(_thisDepth->super_TSymbol)._vptr_TSymbol[0x28])(_thisDepth,(ulong)(uint)memb);
          lVar12 = (**(code **)(**(long **)(CONCAT44(extraout_var_25,iVar5) + 8) + 0x50))();
          bVar4 = shouldFlatten(this,pTVar10,(TStorageQualifier)*(undefined8 *)(lVar12 + 8) & 0x7f,
                                true);
          if (bVar4) {
            local_25c = 0;
            while( true ) {
              iVar5 = (*(_thisDepth->super_TSymbol)._vptr_TSymbol[0x28])
                                (_thisDepth,(ulong)(uint)memb);
              this_00 = &TType::getStruct(*(TType **)(CONCAT44(extraout_var_26,iVar5) + 8))->
                         super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
              ;
              sVar8 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                      size(this_00);
              if ((int)sVar8 <= local_25c) break;
              std::
              vector<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>
              ::push_back(_qual,&local_258);
              local_25c = local_25c + 1;
            }
          }
          else {
            std::
            vector<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>
            ::push_back(_qual,&local_258);
          }
        }
      }
    }
    if ((pTStack_38 == (TIntermConstantUnion *)qualifierList) &&
       (iVar5 = (*(pTStack_38->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[6])(),
       pTVar2 = _thisDepth, CONCAT44(extraout_var_27,iVar5) != 0)) {
      iVar5 = (*(pTStack_38->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[4])();
      pTStack_38 = (TIntermConstantUnion *)
                   addOutputArgumentConversions
                             (this,pTVar2,(TIntermOperator *)CONCAT44(extraout_var_28,iVar5));
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  local_210);
  }
LAB_00565500:
  if (pTStack_38 == (TIntermConstantUnion *)0x0) {
    pTStack_38 = TIntermediate::addConstantUnion
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate,0.0,
                            EbtFloat,(TSourceLoc *)function_local,false);
  }
  return &pTStack_38->super_TIntermTyped;
}

Assistant:

TIntermTyped* HlslParseContext::handleFunctionCall(const TSourceLoc& loc, TFunction* function, TIntermTyped* arguments)
{
    TIntermTyped* result = nullptr;

    TOperator op = function->getBuiltInOp();
    if (op != EOpNull) {
        //
        // Then this should be a constructor.
        // Don't go through the symbol table for constructors.
        // Their parameters will be verified algorithmically.
        //
        TType type(EbtVoid);  // use this to get the type back
        if (! constructorError(loc, arguments, *function, op, type)) {
            //
            // It's a constructor, of type 'type'.
            //
            result = handleConstructor(loc, arguments, type);
            if (result == nullptr) {
                error(loc, "cannot construct with these arguments", type.getCompleteString().c_str(), "");
                return nullptr;
            }
        }
    } else {
        //
        // Find it in the symbol table.
        //
        const TFunction* fnCandidate = nullptr;
        bool builtIn = false;
        int thisDepth = 0;

        // For mat mul, the situation is unusual: we have to compare vector sizes to mat row or col sizes,
        // and clamp the opposite arg.  Since that's complex, we farm it off to a separate method.
        // It doesn't naturally fall out of processing an argument at a time in isolation.
        if (function->getName() == "mul")
            addGenMulArgumentConversion(loc, *function, arguments);

        TIntermAggregate* aggregate = arguments ? arguments->getAsAggregate() : nullptr;

        // TODO: this needs improvement: there's no way at present to look up a signature in
        // the symbol table for an arbitrary type.  This is a temporary hack until that ability exists.
        // It will have false positives, since it doesn't check arg counts or types.
        if (arguments) {
            // Check if first argument is struct buffer type.  It may be an aggregate or a symbol, so we
            // look for either case.

            TIntermTyped* arg0 = nullptr;

            if (aggregate && aggregate->getSequence().size() > 0 && aggregate->getSequence()[0])
                arg0 = aggregate->getSequence()[0]->getAsTyped();
            else if (arguments->getAsSymbolNode())
                arg0 = arguments->getAsSymbolNode();

            if (arg0 != nullptr && isStructBufferType(arg0->getType())) {
                static const int methodPrefixSize = sizeof(BUILTIN_PREFIX)-1;

                if (function->getName().length() > methodPrefixSize &&
                    isStructBufferMethod(function->getName().substr(methodPrefixSize))) {
                    const TString mangle = function->getName() + "(";
                    TSymbol* symbol = symbolTable.find(mangle, &builtIn);

                    if (symbol)
                        fnCandidate = symbol->getAsFunction();
                }
            }
        }

        if (fnCandidate == nullptr)
            fnCandidate = findFunction(loc, *function, builtIn, thisDepth, arguments);

        if (fnCandidate) {
            // This is a declared function that might map to
            //  - a built-in operator,
            //  - a built-in function not mapped to an operator, or
            //  - a user function.

            // turn an implicit member-function resolution into an explicit call
            TString callerName;
            if (thisDepth == 0)
                callerName = fnCandidate->getMangledName();
            else {
                // get the explicit (full) name of the function
                callerName = currentTypePrefix[currentTypePrefix.size() - thisDepth];
                callerName += fnCandidate->getMangledName();
                // insert the implicit calling argument
                pushFrontArguments(intermediate.addSymbol(*getImplicitThis(thisDepth)), arguments);
            }

            // Convert 'in' arguments, so that types match.
            // However, skip those that need expansion, that is covered next.
            if (arguments)
                addInputArgumentConversions(*fnCandidate, arguments);

            // Expand arguments.  Some arguments must physically expand to a different set
            // than what the shader declared and passes.
            if (arguments && !builtIn)
                expandArguments(loc, *fnCandidate, arguments);

            // Expansion may have changed the form of arguments
            aggregate = arguments ? arguments->getAsAggregate() : nullptr;

            op = fnCandidate->getBuiltInOp();
            if (builtIn && op != EOpNull) {
                // SM 4.0 and above guarantees roundEven semantics for round()
                if (!hlslDX9Compatible() && op == EOpRound)
                    op = EOpRoundEven;

                // A function call mapped to a built-in operation.
                result = intermediate.addBuiltInFunctionCall(loc, op, fnCandidate->getParamCount() == 1, arguments,
                                                             fnCandidate->getType());
                if (result == nullptr)  {
                    error(arguments->getLoc(), " wrong operand type", "Internal Error",
                        "built in unary operator function.  Type: %s",
                        static_cast<TIntermTyped*>(arguments)->getCompleteString().c_str());
                } else if (result->getAsOperator()) {
                    builtInOpCheck(loc, *fnCandidate, *result->getAsOperator());
                }
            } else {
                // This is a function call not mapped to built-in operator.
                // It could still be a built-in function, but only if PureOperatorBuiltins == false.
                result = intermediate.setAggregateOperator(arguments, EOpFunctionCall, fnCandidate->getType(), loc);
                TIntermAggregate* call = result->getAsAggregate();
                call->setName(callerName);

                // this is how we know whether the given function is a built-in function or a user-defined function
                // if builtIn == false, it's a userDefined -> could be an overloaded built-in function also
                // if builtIn == true, it's definitely a built-in function with EOpNull
                if (! builtIn) {
                    call->setUserDefined();
                    intermediate.addToCallGraph(infoSink, currentCaller, callerName);
                }
            }

            // for decompositions, since we want to operate on the function node, not the aggregate holding
            // output conversions.
            const TIntermTyped* fnNode = result;

            decomposeStructBufferMethods(loc, result, arguments); // HLSL->AST struct buffer method decompositions
            decomposeIntrinsic(loc, result, arguments);           // HLSL->AST intrinsic decompositions
            decomposeSampleMethods(loc, result, arguments);       // HLSL->AST sample method decompositions
            decomposeGeometryMethods(loc, result, arguments);     // HLSL->AST geometry method decompositions

            // Create the qualifier list, carried in the AST for the call.
            // Because some arguments expand to multiple arguments, the qualifier list will
            // be longer than the formal parameter list.
            if (result == fnNode && result->getAsAggregate()) {
                TQualifierList& qualifierList = result->getAsAggregate()->getQualifierList();
                for (int i = 0; i < fnCandidate->getParamCount(); ++i) {
                    TStorageQualifier qual = (*fnCandidate)[i].type->getQualifier().storage;
                    if (hasStructBuffCounter(*(*fnCandidate)[i].type)) {
                        // add buffer and counter buffer argument qualifier
                        qualifierList.push_back(qual);
                        qualifierList.push_back(qual);
                    } else if (shouldFlatten(*(*fnCandidate)[i].type, (*fnCandidate)[i].type->getQualifier().storage,
                                             true)) {
                        // add structure member expansion
                        for (int memb = 0; memb < (int)(*fnCandidate)[i].type->getStruct()->size(); ++memb)
                            qualifierList.push_back(qual);
                    } else {
                        // Normal 1:1 case
                        qualifierList.push_back(qual);
                    }
                }
            }

            // Convert 'out' arguments.  If it was a constant folded built-in, it won't be an aggregate anymore.
            // Built-ins with a single argument aren't called with an aggregate, but they also don't have an output.
            // Also, build the qualifier list for user function calls, which are always called with an aggregate.
            // We don't do this is if there has been a decomposition, which will have added its own conversions
            // for output parameters.
            if (result == fnNode && result->getAsAggregate())
                result = addOutputArgumentConversions(*fnCandidate, *result->getAsOperator());
        }
    }

    // generic error recovery
    // TODO: simplification: localize all the error recoveries that look like this, and taking type into account to
    //       reduce cascades
    if (result == nullptr)
        result = intermediate.addConstantUnion(0.0, EbtFloat, loc);

    return result;
}